

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O3

int lyb_parse_subtree(char *data,lyd_node *parent,lyd_node **first_sibling,char *yang_data_name,
                     int options,unres_data *unres,lyb_state *lybs)

{
  byte bVar1;
  lyd_node *plVar2;
  lys_node *plVar3;
  lyd_attr *plVar4;
  char *s2;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  lys_module *plVar9;
  lyd_attr *plVar10;
  undefined8 *puVar11;
  lyd_node **pplVar12;
  LYS_NODE LVar13;
  lyd_node *plVar14;
  size_t count_00;
  uint uVar15;
  long lVar16;
  size_t __nmemb;
  byte bVar17;
  ulong uVar18;
  int iVar19;
  lys_module *plVar20;
  char *pcVar21;
  lyd_node_leaf_list *plVar22;
  lys_ext_instance_complex *plVar23;
  bool bVar24;
  lys_module *local_b0;
  lys_module *local_a8;
  lys_module *mod;
  uint local_98;
  uint local_94;
  lys_node *local_90;
  lys_node *snode;
  lyd_attr *local_80;
  char *local_78;
  char *local_70;
  int local_68;
  int local_64;
  char *local_60;
  lys_module *local_58;
  lyd_node *local_50;
  lyd_node **local_48;
  lyd_node_leaf_list *local_40;
  uint local_38;
  byte local_31 [8];
  uint8_t count;
  
  snode = (lys_node *)unres;
  local_50 = parent;
  local_48 = first_sibling;
  local_38 = options;
  if ((parent == (lyd_node *)0x0) != (first_sibling != (lyd_node **)0x0)) {
    __assert_fail("(parent && !first_sibling) || (!parent && first_sibling)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                  ,0x3f8,
                  "int lyb_parse_subtree(const char *, struct lyd_node *, struct lyd_node **, const char *, int, struct unres_data *, struct lyb_state *)"
                 );
  }
  uVar5 = lyb_read_start_subtree(data,lybs);
  plVar14 = local_50;
  if (-1 < (int)uVar5) {
    pcVar21 = data + uVar5;
    if (local_50 == (lyd_node *)0x0) {
      uVar6 = lyb_parse_model(pcVar21,&local_a8,lybs);
      if (-1 < (int)uVar6) {
        uVar5 = uVar5 + uVar6;
        pcVar21 = pcVar21 + uVar6;
        if (local_a8 != (lys_module *)0x0) {
          uVar6 = lyb_parse_schema_hash
                            ((lys_node *)0x0,local_a8,pcVar21,yang_data_name,local_38,&local_90,lybs
                            );
          bVar24 = true;
          goto LAB_001437c5;
        }
        iVar19 = uVar5 + uVar6;
        pcVar21 = pcVar21 + uVar6;
LAB_00143896:
        iVar7 = lyb_skip_subtree(pcVar21,lybs);
        if (-1 < iVar7) {
          iVar19 = iVar19 + iVar7;
          goto LAB_001438a8;
        }
      }
    }
    else {
      plVar9 = lyd_node_module(local_50);
      local_a8 = plVar9;
      uVar6 = lyb_parse_schema_hash
                        (plVar14->schema,(lys_module *)0x0,pcVar21,(char *)0x0,local_38,&local_90,
                         lybs);
      bVar24 = plVar9 != (lys_module *)0x0;
LAB_001437c5:
      plVar3 = local_90;
      if (-1 < (int)uVar6) {
        iVar19 = uVar5 + uVar6;
        pcVar21 = pcVar21 + uVar6;
        if (!(bool)(bVar24 & local_90 != (lys_node *)0x0)) goto LAB_00143896;
        LVar13 = local_90->nodetype;
        plVar22 = (lyd_node_leaf_list *)0x0;
        local_78 = pcVar21;
        if ((int)LVar13 < 0x20) {
          if (7 < (int)LVar13) {
            if (LVar13 == LYS_LEAFLIST) goto LAB_00143912;
            if (LVar13 != LYS_LIST) goto LAB_001438b5;
            goto LAB_0014390b;
          }
          if (LVar13 == LYS_CONTAINER) goto LAB_0014390b;
          if (LVar13 != LYS_LEAF) goto LAB_001438b5;
LAB_00143912:
          plVar22 = (lyd_node_leaf_list *)calloc(0x50,1);
          if (*(int *)&plVar3[1].ref != 9) goto LAB_00143946;
          plVar22->validity = '\b';
        }
        else {
          if ((int)LVar13 < 0x100) {
            if (LVar13 != LYS_ANYXML) {
              if (LVar13 != LYS_NOTIF) goto LAB_001438b5;
              goto LAB_0014390b;
            }
LAB_00143934:
            __nmemb = 0x40;
          }
          else {
            if (LVar13 != LYS_RPC) {
              if (LVar13 == LYS_ANYDATA) goto LAB_00143934;
              plVar22 = (lyd_node_leaf_list *)0x0;
              if (LVar13 != LYS_ACTION) goto LAB_001438b5;
            }
LAB_0014390b:
            __nmemb = 0x48;
          }
          plVar22 = (lyd_node_leaf_list *)calloc(__nmemb,1);
LAB_00143946:
          if (plVar22 == (lyd_node_leaf_list *)0x0) {
            ly_log(plVar3->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyb_new_node");
            plVar22 = (lyd_node_leaf_list *)0x0;
            goto LAB_001438b5;
          }
        }
        plVar22->schema = plVar3;
        iVar7 = resolve_applies_when(plVar3,0,(lys_node *)0x0);
        if (iVar7 != 0) {
          plVar22->field_0x9 = plVar22->field_0x9 & 0xf1 | 0xc;
        }
        plVar22->prev = (lyd_node *)plVar22;
        local_31[0] = 0;
        local_40 = plVar22;
        uVar5 = lyb_read(local_78,local_31,1,lybs);
        if ((int)uVar5 < 0) {
LAB_00143f72:
          plVar22 = local_40;
          lyd_free_attr(lybs->ctx,(lyd_node *)local_40,local_40->attr,1);
          goto LAB_001438b5;
        }
        uVar18 = (ulong)uVar5;
        if (local_31[0] != 0) {
          pcVar21 = local_78 + uVar18;
          local_80 = (lyd_attr *)0x0;
          plVar9 = (lys_module *)0x0;
          local_64 = iVar19;
          do {
            mod = plVar9;
            uVar5 = lyb_read_start_subtree(pcVar21,lybs);
            if ((int)uVar5 < 0) goto LAB_00143f72;
            uVar6 = lyb_parse_model(pcVar21 + uVar5,&local_b0,lybs);
            if ((int)uVar6 < 0) goto LAB_00143f72;
            uVar15 = (int)uVar18 + uVar5 + uVar6;
            pcVar21 = pcVar21 + uVar5 + uVar6;
            if (local_b0 == (lys_module *)0x0) {
LAB_00143c2f:
              uVar18 = (ulong)uVar15;
              count_00 = lybs->written[(long)lybs->used + -1];
              do {
                uVar5 = lyb_read(pcVar21,(uint8_t *)0x0,count_00,lybs);
                if ((int)uVar5 < 0) goto LAB_00143f72;
                uVar18 = (ulong)((int)uVar18 + uVar5);
                pcVar21 = pcVar21 + uVar5;
                count_00 = lybs->written[(long)lybs->used + -1];
              } while (count_00 != 0);
            }
            else {
              local_58 = local_b0;
              local_60 = (char *)0x0;
              uVar5 = lyb_read_string(pcVar21,&local_60,1,lybs);
              s2 = local_60;
              if ((int)uVar5 < 0) goto LAB_00143f72;
              bVar17 = local_58->ext_size;
              plVar9 = local_58;
              local_98 = uVar15;
              local_94 = uVar5;
              local_70 = pcVar21;
              if (bVar17 != 0) {
                iVar19 = 0;
                do {
                  iVar7 = lys_ext_instance_presence
                                    ((*(plVar9->ctx->models).list)->extensions,plVar9->ext + iVar19,
                                     bVar17 - (char)iVar19);
                  plVar9 = local_58;
                  if (iVar7 == -1) break;
                  iVar7 = iVar7 + iVar19;
                  lVar16 = (long)iVar7;
                  iVar19 = ly_strequal_(local_58->ext[lVar16]->arg_value,s2);
                  if (iVar19 != 0) {
                    plVar20 = plVar9;
                    if (iVar7 != -1) goto LAB_00143ba6;
                    break;
                  }
                  iVar19 = iVar7 + 1;
                  bVar17 = plVar9->ext_size;
                } while (iVar19 < (int)(uint)bVar17);
              }
              pcVar21 = local_60;
              bVar17 = plVar9->inc_size;
              if (bVar17 == 0) {
LAB_00143bb3:
                plVar23 = (lys_ext_instance_complex *)0x0;
              }
              else {
                local_68 = -1;
                uVar18 = 0;
                do {
                  plVar20 = (lys_module *)plVar9->inc[uVar18].submodule;
                  bVar1 = plVar20->ext_size;
                  if (bVar1 != 0) {
                    iVar19 = 0;
                    do {
                      iVar8 = lys_ext_instance_presence
                                        ((*(plVar9->ctx->models).list)->extensions,
                                         plVar20->ext + iVar19,bVar1 - (char)iVar19);
                      iVar7 = local_68;
                      if (iVar8 == -1) break;
                      iVar7 = iVar8 + iVar19;
                      iVar19 = ly_strequal_(plVar20->ext[iVar7]->arg_value,pcVar21);
                      if (iVar19 != 0) break;
                      iVar19 = iVar7 + 1;
                      bVar1 = plVar20->ext_size;
                      plVar9 = local_58;
                      iVar7 = local_68;
                    } while (iVar19 < (int)(uint)bVar1);
                    local_68 = iVar7;
                    bVar17 = local_58->inc_size;
                    plVar9 = local_58;
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 < bVar17);
                if (local_68 == -1) goto LAB_00143bb3;
                lVar16 = (long)local_68;
LAB_00143ba6:
                plVar23 = (lys_ext_instance_complex *)plVar20->ext[lVar16];
              }
              pcVar21 = local_60;
              uVar15 = local_98;
              if (((local_38 >> 9 & 1) != 0) && (plVar23 == (lys_ext_instance_complex *)0x0)) {
                ly_vlog(plVar9->ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                        "Failed to find annotation \"%s\" in \"%s\".",local_60,plVar9->name);
                free(pcVar21);
                goto LAB_00143f72;
              }
              free(local_60);
              iVar19 = local_64;
              plVar4 = local_80;
              uVar15 = uVar15 + local_94;
              pcVar21 = local_70 + local_94;
              local_70 = pcVar21;
              if ((plVar23 == (lys_ext_instance_complex *)0x0) || (local_b0 == (lys_module *)0x0))
              goto LAB_00143c2f;
              if (local_80 == (lyd_attr *)0x0) {
                if (local_40->attr != (lyd_attr *)0x0) {
                  __assert_fail("!node->attr",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                                ,0x348,
                                "int lyb_parse_attributes(struct lyd_node *, const char *, int, struct unres_data *, struct lyb_state *)"
                               );
                }
                plVar10 = (lyd_attr *)calloc(1,0x38);
                if (plVar10 == (lyd_attr *)0x0) goto LAB_00143f52;
                local_40->attr = plVar10;
              }
              else {
                plVar10 = (lyd_attr *)calloc(1,0x38);
                plVar4->next = plVar10;
                if (plVar10 == (lyd_attr *)0x0) {
LAB_00143f52:
                  ly_log(lybs->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "lyb_parse_attributes");
                  goto LAB_00143f72;
                }
              }
              plVar10->annotation = plVar23;
              pcVar21 = lydict_insert(lybs->ctx,plVar23->arg_value,0);
              plVar10->name = pcVar21;
              local_80 = plVar10;
              puVar11 = (undefined8 *)
                        lys_ext_complex_get_substmt
                                  (LY_STMT_TYPE,plVar10->annotation,(lyext_substmt **)0x0);
              pcVar21 = local_70;
              if (((puVar11 == (undefined8 *)0x0) || ((lys_type *)*puVar11 == (lys_type *)0x0)) ||
                 (uVar5 = lyb_parse_value((lys_type *)*puVar11,(lyd_node_leaf_list *)0x0,local_80,
                                          local_70,(unres_data *)snode,lybs), (int)uVar5 < 0))
              goto LAB_00143f72;
              uVar18 = (ulong)(uVar15 + uVar5);
              pcVar21 = pcVar21 + uVar5;
            }
            plVar9 = mod;
            lyb_read_stop_subtree(lybs);
            bVar17 = (char)plVar9 + 1;
            plVar9 = (lys_module *)CONCAT71((int7)((ulong)plVar9 >> 8),bVar17);
          } while (bVar17 < local_31[0]);
          uVar5 = (uint)uVar18;
          plVar22 = local_40;
          if ((int)uVar5 < 0) goto LAB_001438b5;
        }
        plVar22 = local_40;
        iVar19 = iVar19 + uVar5;
        pcVar21 = local_78 + uVar5;
        LVar13 = local_90->nodetype;
        if ((int)LVar13 < 0x20) {
          if ((int)LVar13 < 8) {
            if (LVar13 != LYS_CONTAINER) {
              if (LVar13 != LYS_LEAF) goto LAB_001438b5;
LAB_00143dee:
              uVar5 = lyb_parse_value((lys_type *)&local_40->schema[1].ref,local_40,(lyd_attr *)0x0,
                                      pcVar21,(unres_data *)snode,lybs);
              goto LAB_00143e19;
            }
          }
          else {
            if (LVar13 == LYS_LEAFLIST) goto LAB_00143dee;
            if (LVar13 != LYS_LIST) goto LAB_001438b5;
          }
        }
        else if ((int)LVar13 < 0x100) {
          if (LVar13 == LYS_ANYXML) goto LAB_00143e0b;
          if (LVar13 != LYS_NOTIF) goto LAB_001438b5;
        }
        else if ((LVar13 != LYS_RPC) && (LVar13 != LYS_ACTION)) {
          if (LVar13 != LYS_ANYDATA) goto LAB_001438b5;
LAB_00143e0b:
          uVar5 = lyb_parse_anydata((lyd_node *)local_40,pcVar21,lybs);
LAB_00143e19:
          if ((int)uVar5 < 0) goto LAB_001438b5;
          iVar19 = iVar19 + uVar5;
          pcVar21 = pcVar21 + uVar5;
        }
        if (local_50 == (lyd_node *)0x0) {
          if (*local_48 == (lyd_node *)0x0) {
            *local_48 = (lyd_node *)plVar22;
          }
          else {
            (*local_48)->prev->next = (lyd_node *)plVar22;
            plVar22->prev = (*local_48)->prev;
            (*local_48)->prev = (lyd_node *)plVar22;
          }
        }
        else {
          plVar14 = local_50->child;
          if (plVar14 == (lyd_node *)0x0) {
            pplVar12 = &local_50->child;
          }
          else {
            plVar2 = plVar14->prev;
            pplVar12 = &plVar14->prev;
            plVar2->next = (lyd_node *)plVar22;
            plVar22->prev = plVar2;
          }
          *pplVar12 = (lyd_node *)plVar22;
          plVar22->parent = local_50;
        }
        while (lybs->written[(long)lybs->used + -1] != 0) {
          uVar5 = lyb_parse_subtree(pcVar21,(lyd_node *)plVar22,(lyd_node **)0x0,(char *)0x0,
                                    local_38,(unres_data *)snode,lybs);
          if ((int)uVar5 < 0) goto LAB_001438b5;
          iVar19 = iVar19 + uVar5;
          pcVar21 = pcVar21 + uVar5;
        }
        plVar3 = plVar22->schema;
        LVar13 = plVar3->nodetype;
        if (LVar13 == LYS_CONTAINER) {
          lVar16._0_2_ = plVar3[1].flags;
          lVar16._2_1_ = plVar3[1].ext_size;
          lVar16._3_1_ = plVar3[1].iffeature_size;
          lVar16._4_1_ = plVar3[1].padding[0];
          lVar16._5_1_ = plVar3[1].padding[1];
          lVar16._6_1_ = plVar3[1].padding[2];
          lVar16._7_1_ = plVar3[1].padding[3];
          if (lVar16 == 0) {
            for (plVar14 = (plVar22->value).instance; plVar14 != (lyd_node *)0x0;
                plVar14 = plVar14->next) {
              if ((plVar14->field_0x9 & 1) == 0) goto LAB_00143f0a;
            }
            plVar22->field_0x9 = plVar22->field_0x9 | 1;
            LVar13 = plVar3->nodetype;
            goto LAB_00143efb;
          }
        }
        else {
LAB_00143efb:
          if ((LVar13 == LYS_LIST) && (plVar3->padding[2] != '\0')) goto LAB_001438a8;
        }
LAB_00143f0a:
        lyd_hash((lyd_node *)plVar22);
        lyd_insert_hash((lyd_node *)plVar22);
LAB_001438a8:
        lyb_read_stop_subtree(lybs);
        return iVar19;
      }
    }
  }
  plVar22 = (lyd_node_leaf_list *)0x0;
LAB_001438b5:
  lyd_free((lyd_node *)plVar22);
  if ((local_48 != (lyd_node **)0x0) && ((lyd_node_leaf_list *)*local_48 == plVar22)) {
    *local_48 = (lyd_node *)0x0;
  }
  return -1;
}

Assistant:

static int
lyb_parse_subtree(const char *data, struct lyd_node *parent, struct lyd_node **first_sibling, const char *yang_data_name,
        int options, struct unres_data *unres, struct lyb_state *lybs)
{
    int r, ret = 0;
    struct lyd_node *node = NULL, *iter;
    const struct lys_module *mod;
    struct lys_node *snode;

    assert((parent && !first_sibling) || (!parent && first_sibling));

    /* register a new subtree */
    ret += (r = lyb_read_start_subtree(data, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    if (!parent) {
        /* top-level, read module name */
        ret += (r = lyb_parse_model(data, &mod, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);

        if (mod) {
            /* read hash, find the schema node starting from mod, possibly yang_data_name */
            r = lyb_parse_schema_hash(NULL, mod, data, yang_data_name, options, &snode, lybs);
        }
    } else {
        mod = lyd_node_module(parent);

        /* read hash, find the schema node starting from parent schema */
        r = lyb_parse_schema_hash(parent->schema, NULL, data, NULL, options, &snode, lybs);
    }
    ret += r;
    LYB_HAVE_READ_GOTO(r, data, error);

    if (!mod || !snode) {
        /* unknown data subtree, skip it whole */
        ret += (r = lyb_skip_subtree(data, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
        goto stop_subtree;
    }

    /*
     * read the node
     */
    node = lyb_new_node(snode);
    if (!node) {
        goto error;
    }

    ret += (r = lyb_parse_attributes(node, data, options, unres, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    /* read node content */
    switch (snode->nodetype) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
        /* nothing to read */
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        ret += (r = lyb_parse_value(&((struct lys_node_leaf *)node->schema)->type, (struct lyd_node_leaf_list *)node,
                                    NULL, data, unres, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        ret += (r = lyb_parse_anydata(node, data, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
        break;
    default:
        goto error;
    }

    /* insert into data tree, manually */
    if (parent) {
        if (!parent->child) {
            /* only child */
            parent->child = node;
        } else {
            /* last child */
            parent->child->prev->next = node;
            node->prev = parent->child->prev;
            parent->child->prev = node;
        }
        node->parent = parent;
    } else if (*first_sibling) {
        /* last sibling */
        (*first_sibling)->prev->next = node;
        node->prev = (*first_sibling)->prev;
        (*first_sibling)->prev = node;
    } else {
        /* only sibling */
        *first_sibling = node;
    }

    /* read all descendants */
    while (lybs->written[lybs->used - 1]) {
        ret += (r = lyb_parse_subtree(data, node, NULL, NULL, options, unres, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
    }

    /* make containers default if should be */
    if ((node->schema->nodetype == LYS_CONTAINER) && !((struct lys_node_container *)node->schema)->presence) {
        LY_TREE_FOR(node->child, iter) {
            if (!iter->dflt) {
                break;
            }
        }

        if (!iter) {
            node->dflt = 1;
        }
    }

#ifdef LY_ENABLED_CACHE
    /* calculate the hash and insert it into parent (list with keys is handled when its keys are inserted) */
    if ((node->schema->nodetype != LYS_LIST) || !((struct lys_node_list *)node->schema)->keys_size) {
        lyd_hash(node);
        lyd_insert_hash(node);
    }
#endif

stop_subtree:
    /* end the subtree */
    lyb_read_stop_subtree(lybs);

    return ret;

error:
    lyd_free(node);
    if (first_sibling && (*first_sibling == node)) {
        *first_sibling = NULL;
    }
    return -1;
}